

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ui::FindLEDs_abi_cxx11_(void)

{
  bool bVar1;
  istream *piVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  undefined1 local_550 [8];
  string name;
  string local_528;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4c9;
  string local_4c8;
  undefined1 local_4a8 [8];
  process ls;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names;
  
  ls.status_._3_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"ls",&local_4c9);
  procxx::process::process<>((process *)local_4a8,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"-C1",&local_501);
  procxx::process::add_argument((process *)local_4a8,&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"/sys/class/leds/",
             (allocator<char> *)(name.field_2._M_local_buf + 0xf));
  procxx::process::add_argument((process *)local_4a8,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
  procxx::process::exec((process *)local_4a8);
  std::__cxx11::string::string((string *)local_550);
  while( true ) {
    piVar2 = procxx::process::output((process *)local_4a8);
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (piVar2,(string *)local_550);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_RDI,(value_type *)local_550);
  }
  ls.status_._3_1_ = 1;
  std::__cxx11::string::~string((string *)local_550);
  procxx::process::~process((process *)local_4a8);
  if ((ls.status_._3_1_ & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_RDI);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> FindLEDs() {
  std::vector<std::string> names;

  procxx::process ls{"ls"};
  ls.add_argument("-C1");
  ls.add_argument("/sys/class/leds/");
  ls.exec();

  std::string name;
  while (std::getline(ls.output(), name))
    names.push_back(name);
  return names;
}